

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O1

uint8 GetCellEdgeIncidenceMask(S2Cell *cell,S2Point *p,double tolerance_uv)

{
  byte bVar1;
  byte bVar2;
  int b;
  bool bVar3;
  double dVar4;
  R2Point uv;
  R2Rect bound;
  double local_98;
  double adStack_90 [2];
  ostream *local_80;
  R2Rect local_78;
  R2Rect local_50;
  ostream *local_30;
  ostream *local_28;
  
  local_98 = 0.0;
  adStack_90[0] = 0.0;
  b = (int)cell->face_;
  local_80 = (ostream *)tolerance_uv;
  if (b < 3) {
    dVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)p,b);
    if (0.0 < dVar4) {
LAB_0020dd53:
      S2::ValidFaceXYZtoUV(b,p,&local_98,adStack_90);
      local_78.bounds_[0].bounds_.c_[0] = (cell->uv_).bounds_[0].bounds_.c_[0];
      local_78.bounds_[0].bounds_.c_[1] = (cell->uv_).bounds_[0].bounds_.c_[1];
      local_78.bounds_[1].bounds_.c_[0] = (cell->uv_).bounds_[1].bounds_.c_[0];
      local_78.bounds_[1].bounds_.c_[1] = (cell->uv_).bounds_[1].bounds_.c_[1];
      if (FLAGS_s2debug == true) {
        local_30 = local_80;
        local_28 = local_80;
        R2Rect::Expanded(&local_50,&local_78,(R2Point *)&local_30);
        bVar3 = false;
        if ((local_50.bounds_[0].bounds_.c_[0] <= local_98) &&
           (bVar3 = false, local_98 <= local_50.bounds_[0].bounds_.c_[1])) {
          bVar3 = adStack_90[0] <= local_50.bounds_[1].bounds_.c_[1] &&
                  local_50.bounds_[1].bounds_.c_[0] <= adStack_90[0];
        }
        if (!bVar3) {
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)&local_30,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
                     ,0x400,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_28,"Check failed: bound.Expanded(tolerance_uv).Contains(uv) ",0x38);
          abort();
        }
      }
      bVar3 = ABS(adStack_90[0] - local_78.bounds_[1].bounds_.c_[0]) <= (double)local_80;
      bVar1 = bVar3 + 2;
      if ((double)local_80 < ABS(local_98 - local_78.bounds_[0].bounds_.c_[1])) {
        bVar1 = bVar3;
      }
      bVar2 = bVar1 + 4;
      if ((double)local_80 < ABS(adStack_90[0] - local_78.bounds_[1].bounds_.c_[1])) {
        bVar2 = bVar1;
      }
      if (ABS(local_98 - local_78.bounds_[0].bounds_.c_[0]) <= (double)local_80) {
        return bVar2 | 8;
      }
      return bVar2;
    }
  }
  else {
    dVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)p,b + -3);
    if (dVar4 < 0.0) goto LAB_0020dd53;
  }
  return '\0';
}

Assistant:

uint8 GetCellEdgeIncidenceMask(const S2Cell& cell, const S2Point& p,
                               double tolerance_uv) {
  uint8 mask = 0;
  R2Point uv;
  if (S2::FaceXYZtoUV(cell.face(), p, &uv)) {
    R2Rect bound = cell.GetBoundUV();
    if (FLAGS_s2debug) S2_DCHECK(bound.Expanded(tolerance_uv).Contains(uv));
    if (fabs(uv[1] - bound[1][0]) <= tolerance_uv) mask |= 1;
    if (fabs(uv[0] - bound[0][1]) <= tolerance_uv) mask |= 2;
    if (fabs(uv[1] - bound[1][1]) <= tolerance_uv) mask |= 4;
    if (fabs(uv[0] - bound[0][0]) <= tolerance_uv) mask |= 8;
  }
  return mask;
}